

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

float matrix4_determinant(matrix4 *self)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = (self->field_0).m[5];
  fVar2 = (self->field_0).m[0];
  fVar3 = (self->field_0).m[1];
  fVar4 = (self->field_0).m[10];
  fVar5 = (self->field_0).m[0xf];
  fVar6 = (self->field_0).m[6];
  fVar7 = (self->field_0).m[0xb];
  fVar8 = (self->field_0).m[0xd];
  fVar9 = (self->field_0).m[7];
  fVar10 = (self->field_0).m[9];
  fVar11 = (self->field_0).m[0xe];
  fVar12 = (self->field_0).m[4];
  fVar13 = (self->field_0).m[8];
  fVar14 = (self->field_0).m[0xc];
  fVar15 = (self->field_0).m[2];
  fVar16 = (self->field_0).m[3];
  return ((((((((((((fVar10 * fVar6 * fVar16 * fVar14 +
                    fVar13 * fVar1 * fVar16 * fVar11 +
                    fVar4 * fVar12 * fVar16 * fVar8 +
                    fVar13 * fVar9 * fVar15 * fVar8 +
                    fVar7 * fVar1 * fVar15 * fVar14 +
                    fVar10 * fVar12 * fVar15 * fVar5 +
                    fVar4 * fVar3 * fVar9 * fVar14 +
                    fVar6 * fVar3 * fVar13 * fVar5 +
                    fVar7 * fVar3 * fVar12 * fVar11 +
                    fVar2 * fVar9 * fVar10 * fVar11 +
                    fVar2 * fVar1 * fVar4 * fVar5 + fVar2 * fVar6 * fVar7 * fVar8) -
                   fVar2 * fVar1 * fVar7 * fVar11) - fVar2 * fVar6 * fVar10 * fVar5) -
                 fVar2 * fVar9 * fVar4 * fVar8) - fVar3 * fVar12 * fVar4 * fVar5) -
               fVar6 * fVar3 * fVar7 * fVar14) - fVar3 * fVar9 * fVar13 * fVar11) -
             fVar12 * fVar15 * fVar7 * fVar8) - fVar1 * fVar15 * fVar13 * fVar5) -
           fVar9 * fVar15 * fVar10 * fVar14) - fVar12 * fVar16 * fVar10 * fVar11) -
         fVar1 * fVar16 * fVar4 * fVar14) - fVar6 * fVar16 * fVar13 * fVar8;
}

Assistant:

HYPAPI HYP_FLOAT matrix4_determinant(const struct matrix4 *self)
{
	HYP_FLOAT determinant;

	/* using the Leibniz formula */
	/* avoids temporary structures */

	determinant =
	  A4(11, 22, 33, 44) + A4(11, 23, 34, 42) + A4(11, 24, 32, 43)
	+ A4(12, 21, 34, 43) + A4(12, 23, 31, 44) + A4(12, 24, 33, 41)
	+ A4(13, 21, 32, 44) + A4(13, 22, 34, 41) + A4(13, 24, 31, 42)
	+ A4(14, 21, 33, 42) + A4(14, 22, 31, 43) + A4(14, 23, 32, 41)
	- A4(11, 22, 34, 43) - A4(11, 23, 32, 44) - A4(11, 24, 33, 42)
	- A4(12, 21, 33, 44) - A4(12, 23, 34, 41) - A4(12, 24, 31, 43)
	- A4(13, 21, 34, 42) - A4(13, 22, 31, 44) - A4(13, 24, 32, 41)
	- A4(14, 21, 32, 43) - A4(14, 22, 33, 41) - A4(14, 23, 31, 42)
	;

	return determinant;
}